

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GetScreenData(void)

{
  int iVar1;
  uchar *puVar2;
  Image *in_RDI;
  Image *image;
  
  memset(in_RDI,0,0x18);
  iVar1 = GetScreenWidth();
  in_RDI->width = iVar1;
  iVar1 = GetScreenHeight();
  in_RDI->height = iVar1;
  in_RDI->mipmaps = 1;
  in_RDI->format = 7;
  puVar2 = rlReadScreenPixels(in_RDI->width,in_RDI->height);
  in_RDI->data = puVar2;
  return in_RDI;
}

Assistant:

Image GetScreenData(void)
{
    Image image = { 0 };

    image.width = GetScreenWidth();
    image.height = GetScreenHeight();
    image.mipmaps = 1;
    image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
    image.data = rlReadScreenPixels(image.width, image.height);

    return image;
}